

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  idx_t iVar6;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar6 = 0;
    do {
      puVar3 = *(ulong **)(pdVar1 + iVar6 * 8);
      if ((char)puVar3[2] == '\x01') {
        puVar4 = *(ulong **)(pdVar2 + iVar6 * 8);
        if ((char)puVar4[2] == '\0') {
          *(char *)(puVar4 + 2) = (char)puVar3[2];
        }
        else if (((long)puVar3[1] <= (long)puVar4[1]) &&
                (*puVar3 <= *puVar4 || puVar3[1] != puVar4[1])) goto LAB_00ef815d;
        uVar5 = puVar3[1];
        *puVar4 = *puVar3;
        puVar4[1] = uVar5;
      }
LAB_00ef815d:
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}